

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnTable(SharedValidator *this,Location *loc,Type elem_type,Limits *limits)

{
  Result RVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  TableType local_50;
  
  if (((this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((this->options_).features.reference_types_enabled_ != false)) {
    bVar4 = false;
  }
  else {
    RVar1 = PrintError(this,loc,"only one table allowed");
    bVar4 = RVar1.enum_ == Error;
  }
  RVar1 = CheckLimits(this,loc,limits,0xffffffff,"elems");
  bVar3 = RVar1.enum_ == Error | bVar4;
  if (limits->is_shared == true) {
    RVar1 = PrintError(this,loc,"tables may not be shared");
    bVar3 = bVar3 | RVar1.enum_ == Error;
  }
  if ((elem_type.enum_ != FuncRef) && ((this->options_).features.reference_types_enabled_ == false))
  {
    RVar1 = PrintError(this,loc,"tables must have funcref type");
    bVar3 = bVar3 | RVar1.enum_ == Error;
  }
  uVar2 = elem_type.enum_ + 0x17;
  if ((7 < uVar2) || ((0xc5U >> (uVar2 & 0x1f) & 1) == 0)) {
    RVar1 = PrintError(this,loc,"tables must have reference types");
    bVar3 = bVar3 | RVar1.enum_ == Error;
  }
  local_50.limits.has_max = limits->has_max;
  local_50.limits.is_shared = limits->is_shared;
  local_50.limits.is_64 = limits->is_64;
  local_50.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
  local_50.limits.initial = limits->initial;
  local_50.limits.max = limits->max;
  local_50.element = elem_type;
  std::vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>::
  emplace_back<wabt::SharedValidator::TableType>(&this->tables_,&local_50);
  return (Result)(uint)bVar3;
}

Assistant:

Result SharedValidator::OnTable(const Location& loc,
                                Type elem_type,
                                const Limits& limits) {
  Result result = Result::Ok;
  if (tables_.size() > 0 && !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "only one table allowed");
  }
  result |= CheckLimits(loc, limits, UINT32_MAX, "elems");

  if (limits.is_shared) {
    result |= PrintError(loc, "tables may not be shared");
  }
  if (elem_type != Type::FuncRef &&
      !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "tables must have funcref type");
  }
  if (!elem_type.IsRef()) {
    result |= PrintError(loc, "tables must have reference types");
  }

  tables_.push_back(TableType{elem_type, limits});
  return result;
}